

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bheap.c
# Opt level: O3

int main(int argc,char **argv)

{
  code *pcVar1;
  uint32_t uVar2;
  time_t tVar3;
  sx_alloc *alloc;
  sx_bheap *bh;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int i;
  sx_bheap_item sVar9;
  sx_rng rng;
  int local_44;
  sx_rng local_40;
  
  tVar3 = time((time_t *)0x0);
  sx_rng_seed(&local_40,(uint32_t)tVar3);
  alloc = sx_alloc_malloc();
  bh = sx_bheap_create(alloc,0x20);
  puts("\nPushing values to _MIN_ binary heap:");
  uVar2 = sx_rng_gen(&local_40);
  uVar4 = uVar2 % 100 + 1;
  iVar6 = 0x1f;
  do {
    printf("%d - ",(ulong)uVar4);
    sx_bheap_push_min(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  printf("%d\n",(ulong)uVar4);
  sx_bheap_push_min(bh,uVar4,(void *)0x0);
  puts("Pop: ");
  sVar9 = sx_bheap_pop_min(bh);
  iVar6 = 0x1f;
  do {
    printf("%d - ",(ulong)(uint)sVar9.key,sVar9.user);
    sVar9 = sx_bheap_pop_min(bh);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  printf("%d\n",(ulong)(uint)sVar9.key,sVar9.user);
  puts("\nPushing values to _MAX_ binary heap:");
  uVar2 = sx_rng_gen(&local_40);
  uVar4 = uVar2 % 100 + 1;
  iVar6 = 0x1f;
  do {
    printf("%d - ",(ulong)uVar4);
    sx_bheap_push_max(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  printf("%d\n",(ulong)uVar4);
  sx_bheap_push_max(bh,uVar4,(void *)0x0);
  puts("Pop: ");
  sVar9 = sx_bheap_pop_max(bh);
  iVar6 = 0x1f;
  do {
    printf("%d - ",(ulong)(uint)sVar9.key,sVar9.user);
    sVar9 = sx_bheap_pop_max(bh);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  printf("%d\n",(ulong)(uint)sVar9.key,sVar9.user);
  puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
  local_44 = 0;
  iVar6 = 0;
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar6 == 0x1f) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_min(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    if (uVar2 % 100 < 0x31) {
      sVar9 = sx_bheap_pop_min(bh);
      if (0 < bh->count) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          if (*(int *)((long)&bh->items->key + lVar7) < sVar9.key) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                              ,0x45,"key <= bh->items[k].key");
            pcVar1 = (code *)swi(3);
            iVar6 = (*pcVar1)();
            return iVar6;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar8 < bh->count);
      }
      local_44 = local_44 + 1;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x20);
  puts("Pop Remaining: ");
  if (local_44 < 0x20) {
    iVar6 = 1;
    if (1 < 0x20 - local_44) {
      iVar6 = 0x20 - local_44;
    }
    do {
      sVar9 = sx_bheap_pop_min(bh);
      printf("%d - ",(ulong)(uint)sVar9.key,sVar9.user);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  putchar(10);
  puts("\nPushing values to _MAX_ binary heap with Random pops during push:");
  iVar6 = 0;
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar6 == 0x1f) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_max(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    if (uVar2 % 100 < 0x31) {
      sVar9 = sx_bheap_pop_max(bh);
      if (0 < bh->count) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          if (sVar9.key < *(int *)((long)&bh->items->key + lVar7)) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                              ,0x5d,"key >= bh->items[k].key");
            pcVar1 = (code *)swi(3);
            iVar6 = (*pcVar1)();
            return iVar6;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar8 < bh->count);
      }
      local_44 = local_44 + 1;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x20);
  puts("Pop Remaining: ");
  if (local_44 < 0x20) {
    iVar6 = 1;
    if (1 < 0x20 - local_44) {
      iVar6 = 0x20 - local_44;
    }
    do {
      sVar9 = sx_bheap_pop_max(bh);
      printf("%d - ",(ulong)(uint)sVar9.key,sVar9.user);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    static const int N = 32;

    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));

    const sx_alloc* alloc = sx_alloc_malloc();
    sx_bheap* bh = sx_bheap_create(alloc, N);

    puts("\nPushing values to _MIN_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MAX_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
    int num_pop = 0;

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_min(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key <= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        printf("%d - ", item.key);
    }
    puts("");

    puts("\nPushing values to _MAX_ binary heap with Random pops during push:");

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_max(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key >= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        printf("%d - ", item.key);
    }
    puts("");

    return 0;
}